

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O0

void __thiscall fizplex::Base::swap_columns(Base *this,size_t i,size_t j)

{
  reference __i;
  reference pvVar1;
  type __a;
  type __b;
  pointer in_RDX;
  pointer in_RSI;
  ETM *in_RDI;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  
  uVar2 = false;
  if (in_RSI < in_RDI[1].eta.values.
               super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    uVar2 = in_RDX < in_RDI[1].eta.values.
                     super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  if ((bool)uVar2 == false) {
    __assert_fail("i < m && j < m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base.cc"
                  ,0x1c,"void fizplex::Base::swap_columns(size_t, size_t)");
  }
  __i = std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::operator[]
                  ((vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *)in_RDI,
                   (size_type)in_RSI);
  std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::operator[]
            ((vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *)in_RDI,
             (size_type)in_RDX);
  std::swap<fizplex::Base::ETM>((ETM *)CONCAT17(uVar2,in_stack_ffffffffffffffe0),in_RDI);
  pvVar1 = std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::operator[]
                     ((vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *)in_RDI,
                      (size_type)in_RSI);
  pvVar1->col = (size_t)in_RSI;
  pvVar1 = std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::operator[]
                     ((vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *)in_RDI,
                      (size_type)in_RDX);
  pvVar1->col = (size_t)in_RDX;
  __a = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
                  ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)in_RSI,
                   (size_t)__i);
  __b = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
                  ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)in_RSI,
                   (size_t)__i);
  std::swap<unsigned_long>(__a,__b);
  return;
}

Assistant:

void Base::swap_columns(size_t i, size_t j) {
  assert(i < m && j < m);
  std::swap(etms[i], etms[j]);
  etms[i].col = i;
  etms[j].col = j;
  std::swap<size_t>(row_ordering[i], row_ordering[j]);
}